

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd160.c
# Opt level: O2

void mbedtls_ripemd160_process(mbedtls_ripemd160_context *ctx,uchar *data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  
  iVar1 = *(int *)data;
  iVar2 = *(int *)(data + 4);
  iVar3 = *(int *)(data + 0x14);
  uVar4 = ctx->state[0];
  uVar5 = ctx->state[1];
  uVar6 = ctx->state[2];
  uVar7 = ctx->state[3];
  uVar8 = ctx->state[4];
  uVar22 = (uVar6 ^ uVar5 ^ uVar7) + uVar4 + iVar1;
  uVar22 = (uVar22 * 0x800 | uVar22 >> 0x15) + uVar8;
  uVar23 = uVar6 << 10 | uVar6 >> 0x16;
  uVar28 = iVar3 + uVar4 + 0x50a28be6 + ((~uVar7 | uVar6) ^ uVar5);
  uVar24 = (uVar23 ^ uVar5 ^ uVar22) + uVar8 + iVar2;
  uVar29 = (uVar28 * 0x100 | uVar28 >> 0x18) + uVar8;
  iVar9 = *(int *)(data + 0x38);
  uVar30 = iVar9 + uVar8 + 0x50a28be6 + ((~uVar23 | uVar5) ^ uVar29);
  uVar25 = (uVar24 * 0x4000 | uVar24 >> 0x12) + uVar7;
  uVar24 = uVar5 << 10 | uVar5 >> 0x16;
  iVar10 = *(int *)(data + 8);
  uVar28 = (uVar22 ^ uVar24 ^ uVar25) + uVar7 + iVar10;
  uVar31 = (uVar30 * 0x200 | uVar30 >> 0x17) + uVar7;
  iVar11 = *(int *)(data + 0x1c);
  uVar30 = uVar7 + iVar11 + 0x50a28be6 + ((~uVar24 | uVar29) ^ uVar31);
  uVar26 = (uVar28 * 0x8000 | uVar28 >> 0x11) + uVar23;
  uVar28 = uVar22 * 0x400 | uVar22 >> 0x16;
  iVar12 = *(int *)(data + 0xc);
  uVar22 = (uVar25 ^ uVar28 ^ uVar26) + iVar12 + uVar23;
  uVar27 = (uVar30 * 0x200 | uVar30 >> 0x17) + uVar23;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar23 = uVar23 + iVar1 + 0x50a28be6 + ((~uVar29 | uVar31) ^ uVar27);
  uVar30 = (uVar22 * 0x1000 | uVar22 >> 0x14) + uVar24;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  iVar13 = *(int *)(data + 0x10);
  uVar22 = (uVar26 ^ uVar25 ^ uVar30) + uVar24 + iVar13;
  uVar23 = (uVar23 * 0x800 | uVar23 >> 0x15) + uVar24;
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  iVar14 = *(int *)(data + 0x24);
  uVar24 = uVar24 + iVar14 + 0x50a28be6 + ((~uVar31 | uVar27) ^ uVar23);
  uVar22 = (uVar22 * 0x20 | uVar22 >> 0x1b) + uVar28;
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar28 = uVar28 + iVar3 + (uVar30 ^ uVar26 ^ uVar22);
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar24 = (uVar24 * 0x2000 | uVar24 >> 0x13) + uVar29;
  uVar29 = uVar29 + iVar10 + 0x50a28be6 + ((~uVar27 | uVar23) ^ uVar24);
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar28 = (uVar28 * 0x100 | uVar28 >> 0x18) + uVar25;
  iVar15 = *(int *)(data + 0x18);
  uVar25 = uVar25 + iVar15 + (uVar22 ^ uVar30 ^ uVar28);
  uVar29 = (uVar29 * 0x8000 | uVar29 >> 0x11) + uVar31;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  iVar16 = *(int *)(data + 0x2c);
  uVar31 = uVar31 + iVar16 + 0x50a28be6 + ((~uVar23 | uVar24) ^ uVar29);
  uVar22 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar25 = (uVar25 * 0x80 | uVar25 >> 0x19) + uVar26;
  uVar26 = uVar26 + iVar11 + (uVar28 ^ uVar22 ^ uVar25);
  uVar31 = (uVar31 * 0x8000 | uVar31 >> 0x11) + uVar27;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar27 = uVar27 + iVar13 + 0x50a28be6 + ((~uVar24 | uVar29) ^ uVar31);
  uVar26 = (uVar26 * 0x200 | uVar26 >> 0x17) + uVar30;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  iVar17 = *(int *)(data + 0x20);
  uVar30 = uVar30 + iVar17 + (uVar25 ^ uVar28 ^ uVar26);
  uVar27 = (uVar27 * 0x20 | uVar27 >> 0x1b) + uVar23;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  iVar18 = *(int *)(data + 0x34);
  uVar23 = uVar23 + iVar18 + 0x50a28be6 + ((~uVar29 | uVar31) ^ uVar27);
  uVar30 = (uVar30 * 0x800 | uVar30 >> 0x15) + uVar22;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar22 = uVar22 + iVar14 + (uVar26 ^ uVar25 ^ uVar30);
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar23 = (uVar23 * 0x80 | uVar23 >> 0x19) + uVar24;
  uVar24 = uVar24 + iVar15 + 0x50a28be6 + ((~uVar31 | uVar27) ^ uVar23);
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar22 = (uVar22 * 0x2000 | uVar22 >> 0x13) + uVar28;
  iVar19 = *(int *)(data + 0x28);
  uVar28 = uVar28 + iVar19 + (uVar30 ^ uVar26 ^ uVar22);
  uVar24 = (uVar24 * 0x80 | uVar24 >> 0x19) + uVar29;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  iVar20 = *(int *)(data + 0x3c);
  uVar29 = uVar29 + iVar20 + 0x50a28be6 + ((~uVar27 | uVar23) ^ uVar24);
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar28 = (uVar28 * 0x4000 | uVar28 >> 0x12) + uVar25;
  uVar25 = uVar25 + iVar16 + (uVar22 ^ uVar30 ^ uVar28);
  uVar29 = (uVar29 * 0x100 | uVar29 >> 0x18) + uVar31;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar31 = uVar31 + iVar17 + 0x50a28be6 + ((~uVar23 | uVar24) ^ uVar29);
  iVar21 = *(int *)(data + 0x30);
  uVar25 = (uVar25 * 0x8000 | uVar25 >> 0x11) + uVar26;
  uVar22 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar26 = uVar26 + iVar21 + (uVar28 ^ uVar22 ^ uVar25);
  uVar31 = (uVar31 * 0x800 | uVar31 >> 0x15) + uVar27;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar27 = uVar27 + iVar2 + 0x50a28be6 + ((~uVar24 | uVar29) ^ uVar31);
  uVar26 = (uVar26 * 0x40 | uVar26 >> 0x1a) + uVar30;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar30 = uVar30 + iVar18 + (uVar25 ^ uVar28 ^ uVar26);
  uVar27 = (uVar27 * 0x4000 | uVar27 >> 0x12) + uVar23;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar23 = uVar23 + iVar19 + 0x50a28be6 + ((~uVar29 | uVar31) ^ uVar27);
  uVar30 = (uVar30 * 0x80 | uVar30 >> 0x19) + uVar22;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar22 = uVar22 + iVar9 + (uVar26 ^ uVar25 ^ uVar30);
  uVar23 = (uVar23 * 0x4000 | uVar23 >> 0x12) + uVar24;
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar24 = uVar24 + iVar12 + 0x50a28be6 + ((~uVar31 | uVar27) ^ uVar23);
  uVar22 = (uVar22 * 0x200 | uVar22 >> 0x17) + uVar28;
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar28 = uVar28 + iVar20 + (uVar30 ^ uVar26 ^ uVar22);
  uVar24 = (uVar24 * 0x1000 | uVar24 >> 0x14) + uVar29;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar29 = uVar29 + iVar21 + 0x50a28be6 + ((~uVar27 | uVar23) ^ uVar24);
  uVar28 = (uVar28 * 0x100 | uVar28 >> 0x18) + uVar25;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar25 = uVar25 + iVar11 + 0x5a827999 + ((uVar22 ^ uVar30) & uVar28 ^ uVar30);
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar29 = (uVar29 * 0x40 | uVar29 >> 0x1a) + uVar31;
  uVar31 = uVar31 + iVar15 + 0x5c4dd124 + ((uVar29 ^ uVar24) & uVar23 ^ uVar24);
  uVar25 = (uVar25 * 0x80 | uVar25 >> 0x19) + uVar26;
  uVar22 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar26 = uVar26 + iVar13 + 0x5a827999 + ((uVar28 ^ uVar22) & uVar25 ^ uVar22);
  uVar31 = (uVar31 * 0x200 | uVar31 >> 0x17) + uVar27;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar27 = uVar27 + iVar16 + 0x5c4dd124 + ((uVar31 ^ uVar29) & uVar24 ^ uVar29);
  uVar26 = (uVar26 * 0x40 | uVar26 >> 0x1a) + uVar30;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar30 = uVar30 + iVar18 + 0x5a827999 + ((uVar25 ^ uVar28) & uVar26 ^ uVar28);
  uVar27 = (uVar27 * 0x2000 | uVar27 >> 0x13) + uVar23;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar23 = uVar23 + iVar12 + 0x5c4dd124 + ((uVar27 ^ uVar31) & uVar29 ^ uVar31);
  uVar30 = (uVar30 * 0x100 | uVar30 >> 0x18) + uVar22;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar22 = uVar22 + iVar2 + 0x5a827999 + ((uVar26 ^ uVar25) & uVar30 ^ uVar25);
  uVar23 = (uVar23 * 0x8000 | uVar23 >> 0x11) + uVar24;
  uVar32 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar24 = uVar24 + iVar11 + 0x5c4dd124 + ((uVar23 ^ uVar27) & uVar32 ^ uVar27);
  uVar22 = (uVar22 * 0x2000 | uVar22 >> 0x13) + uVar28;
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar28 = uVar28 + iVar19 + 0x5a827999 + ((uVar30 ^ uVar26) & uVar22 ^ uVar26);
  uVar24 = (uVar24 * 0x80 | uVar24 >> 0x19) + uVar29;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar29 = uVar29 + iVar1 + 0x5c4dd124 + ((uVar24 ^ uVar23) & uVar27 ^ uVar23);
  uVar28 = (uVar28 * 0x800 | uVar28 >> 0x15) + uVar25;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar25 = uVar25 + iVar15 + 0x5a827999 + ((uVar22 ^ uVar30) & uVar28 ^ uVar30);
  uVar31 = (uVar29 * 0x1000 | uVar29 >> 0x14) + uVar32;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar29 = uVar32 + iVar18 + 0x5c4dd124 + ((uVar31 ^ uVar24) & uVar23 ^ uVar24);
  uVar25 = (uVar25 * 0x200 | uVar25 >> 0x17) + uVar26;
  uVar22 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar26 = uVar26 + iVar20 + 0x5a827999 + ((uVar28 ^ uVar22) & uVar25 ^ uVar22);
  uVar32 = (uVar29 * 0x100 | uVar29 >> 0x18) + uVar27;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar27 = uVar27 + iVar3 + 0x5c4dd124 + ((uVar32 ^ uVar31) & uVar24 ^ uVar31);
  uVar26 = (uVar26 * 0x80 | uVar26 >> 0x19) + uVar30;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar30 = uVar30 + iVar12 + 0x5a827999 + ((uVar25 ^ uVar28) & uVar26 ^ uVar28);
  uVar29 = (uVar27 * 0x200 | uVar27 >> 0x17) + uVar23;
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar23 = uVar23 + iVar19 + 0x5c4dd124 + ((uVar29 ^ uVar32) & uVar31 ^ uVar32);
  uVar30 = (uVar30 * 0x8000 | uVar30 >> 0x11) + uVar22;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar22 = uVar22 + iVar21 + 0x5a827999 + ((uVar26 ^ uVar25) & uVar30 ^ uVar25);
  uVar23 = (uVar23 * 0x800 | uVar23 >> 0x15) + uVar24;
  uVar32 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar24 = uVar24 + iVar9 + 0x5c4dd124 + ((uVar23 ^ uVar29) & uVar32 ^ uVar29);
  uVar22 = (uVar22 * 0x80 | uVar22 >> 0x19) + uVar28;
  uVar27 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar28 = uVar28 + iVar1 + 0x5a827999 + ((uVar30 ^ uVar27) & uVar22 ^ uVar27);
  uVar24 = (uVar24 * 0x80 | uVar24 >> 0x19) + uVar31;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar26 = uVar31 + iVar20 + 0x5c4dd124 + ((uVar24 ^ uVar23) & uVar29 ^ uVar23);
  uVar28 = (uVar28 * 0x1000 | uVar28 >> 0x14) + uVar25;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar25 = uVar25 + iVar14 + 0x5a827999 + ((uVar22 ^ uVar30) & uVar28 ^ uVar30);
  uVar31 = (uVar26 * 0x80 | uVar26 >> 0x19) + uVar32;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar32 = uVar32 + iVar17 + 0x5c4dd124 + ((uVar31 ^ uVar24) & uVar23 ^ uVar24);
  uVar26 = (uVar25 * 0x8000 | uVar25 >> 0x11) + uVar27;
  uVar22 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar25 = uVar27 + iVar3 + 0x5a827999 + ((uVar28 ^ uVar22) & uVar26 ^ uVar22);
  uVar32 = (uVar32 * 0x1000 | uVar32 >> 0x14) + uVar29;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar29 = uVar29 + iVar21 + 0x5c4dd124 + ((uVar32 ^ uVar31) & uVar24 ^ uVar31);
  uVar27 = (uVar25 * 0x200 | uVar25 >> 0x17) + uVar30;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar30 = uVar30 + iVar10 + 0x5a827999 + ((uVar26 ^ uVar28) & uVar27 ^ uVar28);
  uVar29 = (uVar29 * 0x80 | uVar29 >> 0x19) + uVar23;
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar23 = uVar23 + iVar13 + 0x5c4dd124 + ((uVar29 ^ uVar32) & uVar31 ^ uVar32);
  uVar25 = (uVar30 * 0x800 | uVar30 >> 0x15) + uVar22;
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar22 = uVar22 + iVar9 + 0x5a827999 + ((uVar27 ^ uVar26) & uVar25 ^ uVar26);
  uVar30 = (uVar23 * 0x40 | uVar23 >> 0x1a) + uVar24;
  uVar32 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar24 = uVar24 + iVar14 + 0x5c4dd124 + ((uVar30 ^ uVar29) & uVar32 ^ uVar29);
  uVar22 = (uVar22 * 0x80 | uVar22 >> 0x19) + uVar28;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar23 = uVar28 + iVar16 + 0x5a827999 + ((uVar25 ^ uVar27) & uVar22 ^ uVar27);
  uVar28 = (uVar24 * 0x8000 | uVar24 >> 0x11) + uVar31;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar24 = uVar31 + iVar2 + 0x5c4dd124 + ((uVar28 ^ uVar30) & uVar29 ^ uVar30);
  uVar23 = (uVar23 * 0x2000 | uVar23 >> 0x13) + uVar26;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar26 = uVar26 + iVar17 + 0x5a827999 + (uVar25 & ~uVar23 | uVar23 & uVar22);
  uVar31 = (uVar24 * 0x2000 | uVar24 >> 0x13) + uVar32;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar32 = uVar32 + iVar10 + 0x5c4dd124 + ((uVar31 ^ uVar28) & uVar30 ^ uVar28);
  uVar24 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar26 = (uVar26 * 0x1000 | uVar26 >> 0x14) + uVar27;
  uVar27 = uVar27 + iVar12 + 0x6ed9eba1 + ((~uVar23 | uVar26) ^ uVar24);
  uVar32 = (uVar32 * 0x800 | uVar32 >> 0x15) + uVar29;
  uVar22 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar29 = uVar29 + iVar20 + 0x6d703ef3 + ((~uVar31 | uVar32) ^ uVar22);
  uVar28 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar27 = (uVar27 * 0x800 | uVar27 >> 0x15) + uVar25;
  uVar25 = uVar25 + iVar19 + 0x6ed9eba1 + ((~uVar26 | uVar27) ^ uVar28);
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar29 = (uVar29 * 0x200 | uVar29 >> 0x17) + uVar30;
  uVar23 = uVar30 + iVar3 + 0x6d703ef3 + ((~uVar32 | uVar29) ^ uVar31);
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar30 = (uVar25 * 0x2000 | uVar25 >> 0x13) + uVar24;
  uVar24 = uVar24 + iVar9 + 0x6ed9eba1 + ((~uVar27 | uVar30) ^ uVar26);
  uVar32 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar23 = (uVar23 * 0x80 | uVar23 >> 0x19) + uVar22;
  uVar22 = uVar22 + iVar2 + 0x6d703ef3 + ((~uVar29 | uVar23) ^ uVar32);
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar24 = (uVar24 * 0x40 | uVar24 >> 0x1a) + uVar28;
  uVar28 = uVar28 + iVar13 + 0x6ed9eba1 + ((~uVar30 | uVar24) ^ uVar27);
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar22 = (uVar22 * 0x8000 | uVar22 >> 0x11) + uVar31;
  uVar31 = uVar31 + iVar12 + 0x6d703ef3 + ((~uVar23 | uVar22) ^ uVar29);
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar28 = (uVar28 * 0x80 | uVar28 >> 0x19) + uVar26;
  uVar25 = uVar26 + iVar14 + 0x6ed9eba1 + ((~uVar24 | uVar28) ^ uVar30);
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar31 = (uVar31 * 0x800 | uVar31 >> 0x15) + uVar32;
  uVar32 = uVar32 + iVar11 + 0x6d703ef3 + ((~uVar22 | uVar31) ^ uVar23);
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar25 = (uVar25 * 0x4000 | uVar25 >> 0x12) + uVar27;
  uVar26 = uVar27 + iVar20 + 0x6ed9eba1 + ((~uVar28 | uVar25) ^ uVar24);
  uVar22 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar32 = (uVar32 * 0x100 | uVar32 >> 0x18) + uVar29;
  uVar27 = uVar29 + iVar9 + 0x6d703ef3 + ((~uVar31 | uVar32) ^ uVar22);
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar26 = (uVar26 * 0x200 | uVar26 >> 0x17) + uVar30;
  uVar30 = uVar30 + iVar17 + 0x6ed9eba1 + ((~uVar25 | uVar26) ^ uVar28);
  uVar29 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar27 = (uVar27 * 0x40 | uVar27 >> 0x1a) + uVar23;
  uVar23 = uVar23 + iVar15 + 0x6d703ef3 + ((~uVar32 | uVar27) ^ uVar29);
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar30 = (uVar30 * 0x2000 | uVar30 >> 0x13) + uVar24;
  uVar24 = uVar24 + iVar2 + 0x6ed9eba1 + ((~uVar26 | uVar30) ^ uVar25);
  uVar31 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar23 = (uVar23 * 0x40 | uVar23 >> 0x1a) + uVar22;
  uVar22 = uVar22 + iVar14 + 0x6d703ef3 + ((~uVar27 | uVar23) ^ uVar31);
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar24 = (uVar24 * 0x8000 | uVar24 >> 0x11) + uVar28;
  uVar28 = uVar28 + iVar10 + 0x6ed9eba1 + ((~uVar30 | uVar24) ^ uVar26);
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar22 = (uVar22 * 0x4000 | uVar22 >> 0x12) + uVar29;
  uVar29 = uVar29 + iVar16 + 0x6d703ef3 + ((~uVar23 | uVar22) ^ uVar27);
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar28 = (uVar28 * 0x4000 | uVar28 >> 0x12) + uVar25;
  uVar25 = uVar25 + iVar11 + 0x6ed9eba1 + ((~uVar24 | uVar28) ^ uVar30);
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar29 = (uVar29 * 0x1000 | uVar29 >> 0x14) + uVar31;
  uVar31 = uVar31 + iVar17 + 0x6d703ef3 + ((~uVar22 | uVar29) ^ uVar23);
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar25 = (uVar25 * 0x100 | uVar25 >> 0x18) + uVar26;
  uVar26 = uVar26 + iVar1 + 0x6ed9eba1 + ((~uVar28 | uVar25) ^ uVar24);
  uVar22 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar31 = (uVar31 * 0x2000 | uVar31 >> 0x13) + uVar27;
  uVar27 = uVar27 + iVar21 + 0x6d703ef3 + ((~uVar29 | uVar31) ^ uVar22);
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar26 = (uVar26 * 0x2000 | uVar26 >> 0x13) + uVar30;
  uVar30 = uVar30 + iVar15 + 0x6ed9eba1 + ((~uVar25 | uVar26) ^ uVar28);
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar27 = (uVar27 * 0x20 | uVar27 >> 0x1b) + uVar23;
  uVar23 = uVar23 + iVar10 + 0x6d703ef3 + ((~uVar31 | uVar27) ^ uVar29);
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar30 = (uVar30 * 0x40 | uVar30 >> 0x1a) + uVar24;
  uVar24 = uVar24 + iVar18 + 0x6ed9eba1 + ((~uVar26 | uVar30) ^ uVar25);
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar23 = (uVar23 * 0x4000 | uVar23 >> 0x12) + uVar22;
  uVar22 = uVar22 + iVar19 + 0x6d703ef3 + ((~uVar27 | uVar23) ^ uVar31);
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar24 = (uVar24 * 0x20 | uVar24 >> 0x1b) + uVar28;
  uVar28 = uVar28 + iVar16 + 0x6ed9eba1 + ((~uVar30 | uVar24) ^ uVar26);
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar22 = (uVar22 * 0x2000 | uVar22 >> 0x13) + uVar29;
  uVar29 = uVar29 + iVar1 + 0x6d703ef3 + ((~uVar23 | uVar22) ^ uVar27);
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar28 = (uVar28 * 0x1000 | uVar28 >> 0x14) + uVar25;
  uVar25 = uVar25 + iVar3 + 0x6ed9eba1 + ((~uVar24 | uVar28) ^ uVar30);
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar29 = (uVar29 * 0x2000 | uVar29 >> 0x13) + uVar31;
  uVar31 = uVar31 + iVar13 + 0x6d703ef3 + ((~uVar22 | uVar29) ^ uVar23);
  uVar25 = (uVar25 * 0x80 | uVar25 >> 0x19) + uVar26;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar26 = uVar26 + iVar21 + 0x6ed9eba1 + ((~uVar28 | uVar25) ^ uVar24);
  uVar31 = (uVar31 * 0x80 | uVar31 >> 0x19) + uVar27;
  uVar22 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar27 = uVar27 + iVar18 + 0x6d703ef3 + ((~uVar29 | uVar31) ^ uVar22);
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar26 = (uVar26 * 0x20 | uVar26 >> 0x1b) + uVar30;
  uVar30 = uVar30 + iVar2 + -0x70e44324 + ((uVar26 ^ uVar25) & uVar28 ^ uVar25);
  uVar27 = (uVar27 * 0x20 | uVar27 >> 0x1b) + uVar23;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar23 = uVar23 + iVar17 + 0x7a6d76e9 + ((uVar31 ^ uVar29) & uVar27 ^ uVar29);
  uVar30 = (uVar30 * 0x800 | uVar30 >> 0x15) + uVar24;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar24 = uVar24 + iVar14 + -0x70e44324 + ((uVar30 ^ uVar26) & uVar25 ^ uVar26);
  uVar23 = (uVar23 * 0x8000 | uVar23 >> 0x11) + uVar22;
  uVar32 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar22 = uVar22 + iVar15 + 0x7a6d76e9 + ((uVar27 ^ uVar32) & uVar23 ^ uVar32);
  uVar24 = (uVar24 * 0x1000 | uVar24 >> 0x14) + uVar28;
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar28 = uVar28 + iVar16 + -0x70e44324 + ((uVar24 ^ uVar30) & uVar26 ^ uVar30);
  uVar22 = (uVar22 * 0x20 | uVar22 >> 0x1b) + uVar29;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar29 = uVar29 + iVar13 + 0x7a6d76e9 + ((uVar23 ^ uVar27) & uVar22 ^ uVar27);
  uVar28 = (uVar28 * 0x4000 | uVar28 >> 0x12) + uVar25;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar25 = uVar25 + iVar19 + -0x70e44324 + ((uVar28 ^ uVar24) & uVar30 ^ uVar24);
  uVar31 = (uVar29 * 0x100 | uVar29 >> 0x18) + uVar32;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar29 = uVar32 + iVar2 + 0x7a6d76e9 + ((uVar22 ^ uVar23) & uVar31 ^ uVar23);
  uVar25 = (uVar25 * 0x8000 | uVar25 >> 0x11) + uVar26;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar26 = uVar26 + iVar1 + -0x70e44324 + ((uVar25 ^ uVar28) & uVar24 ^ uVar28);
  uVar32 = (uVar29 * 0x800 | uVar29 >> 0x15) + uVar27;
  uVar22 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar29 = uVar27 + iVar12 + 0x7a6d76e9 + ((uVar31 ^ uVar22) & uVar32 ^ uVar22);
  uVar27 = (uVar26 * 0x4000 | uVar26 >> 0x12) + uVar30;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar30 = uVar30 + iVar17 + -0x70e44324 + ((uVar27 ^ uVar25) & uVar28 ^ uVar25);
  uVar29 = (uVar29 * 0x4000 | uVar29 >> 0x12) + uVar23;
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar23 = uVar23 + iVar16 + 0x7a6d76e9 + ((uVar32 ^ uVar31) & uVar29 ^ uVar31);
  uVar30 = (uVar30 * 0x8000 | uVar30 >> 0x11) + uVar24;
  uVar26 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar24 = uVar24 + iVar21 + -0x70e44324 + ((uVar30 ^ uVar27) & uVar26 ^ uVar27);
  uVar23 = (uVar23 * 0x4000 | uVar23 >> 0x12) + uVar22;
  uVar32 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar22 = uVar22 + iVar20 + 0x7a6d76e9 + ((uVar29 ^ uVar32) & uVar23 ^ uVar32);
  uVar24 = (uVar24 * 0x200 | uVar24 >> 0x17) + uVar28;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar28 = uVar28 + iVar13 + -0x70e44324 + ((uVar24 ^ uVar30) & uVar27 ^ uVar30);
  uVar25 = (uVar22 * 0x40 | uVar22 >> 0x1a) + uVar31;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar31 = uVar31 + iVar1 + 0x7a6d76e9 + ((uVar23 ^ uVar29) & uVar25 ^ uVar29);
  uVar28 = (uVar28 * 0x100 | uVar28 >> 0x18) + uVar26;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar22 = uVar26 + iVar18 + -0x70e44324 + ((uVar28 ^ uVar24) & uVar30 ^ uVar24);
  uVar31 = (uVar31 * 0x4000 | uVar31 >> 0x12) + uVar32;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar32 = uVar32 + iVar3 + 0x7a6d76e9 + ((uVar25 ^ uVar23) & uVar31 ^ uVar23);
  uVar26 = (uVar22 * 0x200 | uVar22 >> 0x17) + uVar27;
  uVar22 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar24 = uVar27 + iVar12 + -0x70e44324 + ((uVar26 ^ uVar28) & uVar22 ^ uVar28);
  uVar32 = (uVar32 * 0x40 | uVar32 >> 0x1a) + uVar29;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar29 = uVar29 + iVar21 + 0x7a6d76e9 + ((uVar31 ^ uVar25) & uVar32 ^ uVar25);
  uVar27 = (uVar24 * 0x4000 | uVar24 >> 0x12) + uVar30;
  uVar24 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar30 = uVar30 + iVar11 + -0x70e44324 + ((uVar27 ^ uVar26) & uVar24 ^ uVar26);
  uVar29 = (uVar29 * 0x200 | uVar29 >> 0x17) + uVar23;
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar28 = uVar23 + iVar10 + 0x7a6d76e9 + ((uVar32 ^ uVar31) & uVar29 ^ uVar31);
  uVar23 = (uVar30 * 0x20 | uVar30 >> 0x1b) + uVar22;
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar22 = uVar22 + iVar20 + -0x70e44324 + ((uVar23 ^ uVar27) & uVar26 ^ uVar27);
  uVar28 = (uVar28 * 0x1000 | uVar28 >> 0x14) + uVar25;
  uVar32 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar30 = uVar25 + iVar18 + 0x7a6d76e9 + ((uVar29 ^ uVar32) & uVar28 ^ uVar32);
  uVar22 = (uVar22 * 0x40 | uVar22 >> 0x1a) + uVar24;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar24 = uVar24 + iVar9 + -0x70e44324 + ((uVar22 ^ uVar23) & uVar27 ^ uVar23);
  uVar30 = (uVar30 * 0x200 | uVar30 >> 0x17) + uVar31;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar31 = uVar31 + iVar14 + 0x7a6d76e9 + ((uVar28 ^ uVar29) & uVar30 ^ uVar29);
  uVar24 = (uVar24 * 0x100 | uVar24 >> 0x18) + uVar26;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar25 = uVar26 + iVar3 + -0x70e44324 + ((uVar24 ^ uVar22) & uVar23 ^ uVar22);
  uVar31 = (uVar31 * 0x1000 | uVar31 >> 0x14) + uVar32;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar32 = uVar32 + iVar11 + 0x7a6d76e9 + ((uVar30 ^ uVar28) & uVar31 ^ uVar28);
  uVar25 = (uVar25 * 0x40 | uVar25 >> 0x1a) + uVar27;
  uVar22 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar26 = uVar27 + iVar15 + -0x70e44324 + ((uVar25 ^ uVar24) & uVar22 ^ uVar24);
  uVar32 = (uVar32 * 0x20 | uVar32 >> 0x1b) + uVar29;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar27 = uVar29 + iVar19 + 0x7a6d76e9 + ((uVar31 ^ uVar30) & uVar32 ^ uVar30);
  uVar26 = (uVar26 * 0x20 | uVar26 >> 0x1b) + uVar23;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar23 = uVar23 + iVar10 + -0x70e44324 + ((uVar26 ^ uVar25) & uVar24 ^ uVar25);
  uVar27 = (uVar27 * 0x8000 | uVar27 >> 0x11) + uVar28;
  uVar29 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar28 = uVar28 + iVar9 + 0x7a6d76e9 + ((uVar32 ^ uVar29) & uVar27 ^ uVar29);
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar23 = (uVar23 * 0x1000 | uVar23 >> 0x14) + uVar22;
  uVar22 = uVar22 + iVar13 + -0x56ac02b2 + ((~uVar25 | uVar26) ^ uVar23);
  uVar28 = (uVar28 * 0x100 | uVar28 >> 0x18) + uVar30;
  uVar31 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar30 = uVar30 + iVar21 + (uVar27 ^ uVar31 ^ uVar28);
  uVar22 = (uVar22 * 0x200 | uVar22 >> 0x17) + uVar24;
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar24 = uVar24 + iVar1 + -0x56ac02b2 + ((~uVar26 | uVar23) ^ uVar22);
  uVar30 = (uVar30 * 0x100 | uVar30 >> 0x18) + uVar29;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar29 = uVar29 + iVar20 + (uVar28 ^ uVar27 ^ uVar30);
  uVar24 = (uVar24 * 0x8000 | uVar24 >> 0x11) + uVar25;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar25 = uVar25 + iVar3 + -0x56ac02b2 + ((~uVar23 | uVar22) ^ uVar24);
  uVar29 = (uVar29 * 0x20 | uVar29 >> 0x1b) + uVar31;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar31 = uVar31 + iVar19 + (uVar30 ^ uVar28 ^ uVar29);
  uVar25 = (uVar25 * 0x20 | uVar25 >> 0x1b) + uVar26;
  uVar22 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar26 = uVar26 + iVar14 + -0x56ac02b2 + ((~uVar22 | uVar24) ^ uVar25);
  uVar31 = (uVar31 * 0x1000 | uVar31 >> 0x14) + uVar27;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar27 = uVar27 + iVar13 + (uVar29 ^ uVar30 ^ uVar31);
  uVar26 = (uVar26 * 0x800 | uVar26 >> 0x15) + uVar23;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar23 = uVar23 + iVar11 + -0x56ac02b2 + ((~uVar24 | uVar25) ^ uVar26);
  uVar27 = (uVar27 * 0x200 | uVar27 >> 0x17) + uVar28;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar28 = uVar28 + iVar2 + (uVar31 ^ uVar29 ^ uVar27);
  uVar23 = (uVar23 * 0x40 | uVar23 >> 0x1a) + uVar22;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar22 = uVar22 + iVar21 + -0x56ac02b2 + ((~uVar25 | uVar26) ^ uVar23);
  uVar28 = (uVar28 * 0x1000 | uVar28 >> 0x14) + uVar30;
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar30 = uVar30 + iVar3 + (uVar27 ^ uVar31 ^ uVar28);
  uVar22 = (uVar22 * 0x100 | uVar22 >> 0x18) + uVar24;
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar24 = uVar24 + iVar10 + -0x56ac02b2 + ((~uVar26 | uVar23) ^ uVar22);
  uVar30 = (uVar30 * 0x20 | uVar30 >> 0x1b) + uVar29;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar29 = uVar29 + iVar17 + (uVar28 ^ uVar27 ^ uVar30);
  uVar24 = (uVar24 * 0x2000 | uVar24 >> 0x13) + uVar25;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar25 = uVar25 + iVar19 + -0x56ac02b2 + ((~uVar23 | uVar22) ^ uVar24);
  uVar29 = (uVar29 * 0x4000 | uVar29 >> 0x12) + uVar31;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar31 = uVar31 + iVar11 + (uVar30 ^ uVar28 ^ uVar29);
  uVar25 = (uVar25 * 0x1000 | uVar25 >> 0x14) + uVar26;
  uVar22 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar26 = uVar26 + iVar9 + -0x56ac02b2 + ((~uVar22 | uVar24) ^ uVar25);
  uVar31 = (uVar31 * 0x40 | uVar31 >> 0x1a) + uVar27;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar27 = uVar27 + iVar15 + (uVar29 ^ uVar30 ^ uVar31);
  uVar26 = (uVar26 * 0x20 | uVar26 >> 0x1b) + uVar23;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar23 = uVar23 + iVar2 + -0x56ac02b2 + ((~uVar24 | uVar25) ^ uVar26);
  uVar27 = (uVar27 * 0x100 | uVar27 >> 0x18) + uVar28;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar28 = uVar28 + iVar10 + (uVar31 ^ uVar29 ^ uVar27);
  uVar23 = (uVar23 * 0x1000 | uVar23 >> 0x14) + uVar22;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar22 = uVar22 + iVar12 + -0x56ac02b2 + ((~uVar25 | uVar26) ^ uVar23);
  uVar28 = (uVar28 * 0x2000 | uVar28 >> 0x13) + uVar30;
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar30 = uVar30 + iVar18 + (uVar27 ^ uVar31 ^ uVar28);
  uVar22 = (uVar22 * 0x2000 | uVar22 >> 0x13) + uVar24;
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar24 = uVar24 + iVar17 + -0x56ac02b2 + ((~uVar26 | uVar23) ^ uVar22);
  uVar30 = (uVar30 * 0x40 | uVar30 >> 0x1a) + uVar29;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar29 = uVar29 + iVar9 + (uVar28 ^ uVar27 ^ uVar30);
  uVar24 = (uVar24 * 0x4000 | uVar24 >> 0x12) + uVar25;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar25 = uVar25 + iVar16 + -0x56ac02b2 + ((~uVar23 | uVar22) ^ uVar24);
  uVar29 = (uVar29 * 0x20 | uVar29 >> 0x1b) + uVar31;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar31 = uVar31 + iVar1 + (uVar30 ^ uVar28 ^ uVar29);
  uVar25 = (uVar25 * 0x800 | uVar25 >> 0x15) + uVar26;
  uVar22 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar26 = uVar26 + iVar15 + -0x56ac02b2 + ((~uVar22 | uVar24) ^ uVar25);
  uVar31 = (uVar31 * 0x8000 | uVar31 >> 0x11) + uVar27;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar27 = uVar27 + iVar12 + (uVar29 ^ uVar30 ^ uVar31);
  uVar26 = (uVar26 * 0x100 | uVar26 >> 0x18) + uVar23;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar23 = uVar23 + iVar20 + -0x56ac02b2 + ((~uVar24 | uVar25) ^ uVar26);
  uVar27 = (uVar27 * 0x2000 | uVar27 >> 0x13) + uVar28;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar28 = uVar28 + iVar14 + (uVar31 ^ uVar29 ^ uVar27);
  uVar23 = (uVar23 * 0x20 | uVar23 >> 0x1b) + uVar22;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar22 = uVar22 + iVar18 + -0x56ac02b2 + ((~uVar25 | uVar26) ^ uVar23);
  uVar28 = (uVar28 * 0x800 | uVar28 >> 0x15) + uVar30;
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar30 = uVar30 + iVar16 + (uVar27 ^ uVar31 ^ uVar28);
  ctx->state[1] = uVar31 + uVar6 + (uVar26 * 0x400 | uVar26 >> 0x16);
  ctx->state[2] = uVar7 + uVar29 + uVar25;
  ctx->state[3] = uVar8 + uVar24 + uVar29 + (uVar30 * 0x800 | uVar30 >> 0x15);
  ctx->state[4] = uVar24 + uVar4 + uVar28 + (uVar22 * 0x40 | uVar22 >> 0x1a);
  ctx->state[0] = (uVar27 * 0x400 | uVar27 >> 0x16) + uVar5 + uVar23;
  return;
}

Assistant:

void mbedtls_ripemd160_process( mbedtls_ripemd160_context *ctx, const unsigned char data[64] )
{
    uint32_t A, B, C, D, E, Ap, Bp, Cp, Dp, Ep, X[16];

    GET_UINT32_LE( X[ 0], data,  0 );
    GET_UINT32_LE( X[ 1], data,  4 );
    GET_UINT32_LE( X[ 2], data,  8 );
    GET_UINT32_LE( X[ 3], data, 12 );
    GET_UINT32_LE( X[ 4], data, 16 );
    GET_UINT32_LE( X[ 5], data, 20 );
    GET_UINT32_LE( X[ 6], data, 24 );
    GET_UINT32_LE( X[ 7], data, 28 );
    GET_UINT32_LE( X[ 8], data, 32 );
    GET_UINT32_LE( X[ 9], data, 36 );
    GET_UINT32_LE( X[10], data, 40 );
    GET_UINT32_LE( X[11], data, 44 );
    GET_UINT32_LE( X[12], data, 48 );
    GET_UINT32_LE( X[13], data, 52 );
    GET_UINT32_LE( X[14], data, 56 );
    GET_UINT32_LE( X[15], data, 60 );

    A = Ap = ctx->state[0];
    B = Bp = ctx->state[1];
    C = Cp = ctx->state[2];
    D = Dp = ctx->state[3];
    E = Ep = ctx->state[4];

#define F1( x, y, z )   ( x ^ y ^ z )
#define F2( x, y, z )   ( ( x & y ) | ( ~x & z ) )
#define F3( x, y, z )   ( ( x | ~y ) ^ z )
#define F4( x, y, z )   ( ( x & z ) | ( y & ~z ) )
#define F5( x, y, z )   ( x ^ ( y | ~z ) )

#define S( x, n ) ( ( x << n ) | ( x >> (32 - n) ) )

#define P( a, b, c, d, e, r, s, f, k )      \
    a += f( b, c, d ) + X[r] + k;           \
    a = S( a, s ) + e;                      \
    c = S( c, 10 );

#define P2( a, b, c, d, e, r, s, rp, sp )   \
    P( a, b, c, d, e, r, s, F, K );         \
    P( a ## p, b ## p, c ## p, d ## p, e ## p, rp, sp, Fp, Kp );

#define F   F1
#define K   0x00000000
#define Fp  F5
#define Kp  0x50A28BE6
    P2( A, B, C, D, E,  0, 11,  5,  8 );
    P2( E, A, B, C, D,  1, 14, 14,  9 );
    P2( D, E, A, B, C,  2, 15,  7,  9 );
    P2( C, D, E, A, B,  3, 12,  0, 11 );
    P2( B, C, D, E, A,  4,  5,  9, 13 );
    P2( A, B, C, D, E,  5,  8,  2, 15 );
    P2( E, A, B, C, D,  6,  7, 11, 15 );
    P2( D, E, A, B, C,  7,  9,  4,  5 );
    P2( C, D, E, A, B,  8, 11, 13,  7 );
    P2( B, C, D, E, A,  9, 13,  6,  7 );
    P2( A, B, C, D, E, 10, 14, 15,  8 );
    P2( E, A, B, C, D, 11, 15,  8, 11 );
    P2( D, E, A, B, C, 12,  6,  1, 14 );
    P2( C, D, E, A, B, 13,  7, 10, 14 );
    P2( B, C, D, E, A, 14,  9,  3, 12 );
    P2( A, B, C, D, E, 15,  8, 12,  6 );
#undef F
#undef K
#undef Fp
#undef Kp

#define F   F2
#define K   0x5A827999
#define Fp  F4
#define Kp  0x5C4DD124
    P2( E, A, B, C, D,  7,  7,  6,  9 );
    P2( D, E, A, B, C,  4,  6, 11, 13 );
    P2( C, D, E, A, B, 13,  8,  3, 15 );
    P2( B, C, D, E, A,  1, 13,  7,  7 );
    P2( A, B, C, D, E, 10, 11,  0, 12 );
    P2( E, A, B, C, D,  6,  9, 13,  8 );
    P2( D, E, A, B, C, 15,  7,  5,  9 );
    P2( C, D, E, A, B,  3, 15, 10, 11 );
    P2( B, C, D, E, A, 12,  7, 14,  7 );
    P2( A, B, C, D, E,  0, 12, 15,  7 );
    P2( E, A, B, C, D,  9, 15,  8, 12 );
    P2( D, E, A, B, C,  5,  9, 12,  7 );
    P2( C, D, E, A, B,  2, 11,  4,  6 );
    P2( B, C, D, E, A, 14,  7,  9, 15 );
    P2( A, B, C, D, E, 11, 13,  1, 13 );
    P2( E, A, B, C, D,  8, 12,  2, 11 );
#undef F
#undef K
#undef Fp
#undef Kp

#define F   F3
#define K   0x6ED9EBA1
#define Fp  F3
#define Kp  0x6D703EF3
    P2( D, E, A, B, C,  3, 11, 15,  9 );
    P2( C, D, E, A, B, 10, 13,  5,  7 );
    P2( B, C, D, E, A, 14,  6,  1, 15 );
    P2( A, B, C, D, E,  4,  7,  3, 11 );
    P2( E, A, B, C, D,  9, 14,  7,  8 );
    P2( D, E, A, B, C, 15,  9, 14,  6 );
    P2( C, D, E, A, B,  8, 13,  6,  6 );
    P2( B, C, D, E, A,  1, 15,  9, 14 );
    P2( A, B, C, D, E,  2, 14, 11, 12 );
    P2( E, A, B, C, D,  7,  8,  8, 13 );
    P2( D, E, A, B, C,  0, 13, 12,  5 );
    P2( C, D, E, A, B,  6,  6,  2, 14 );
    P2( B, C, D, E, A, 13,  5, 10, 13 );
    P2( A, B, C, D, E, 11, 12,  0, 13 );
    P2( E, A, B, C, D,  5,  7,  4,  7 );
    P2( D, E, A, B, C, 12,  5, 13,  5 );
#undef F
#undef K
#undef Fp
#undef Kp

#define F   F4
#define K   0x8F1BBCDC
#define Fp  F2
#define Kp  0x7A6D76E9
    P2( C, D, E, A, B,  1, 11,  8, 15 );
    P2( B, C, D, E, A,  9, 12,  6,  5 );
    P2( A, B, C, D, E, 11, 14,  4,  8 );
    P2( E, A, B, C, D, 10, 15,  1, 11 );
    P2( D, E, A, B, C,  0, 14,  3, 14 );
    P2( C, D, E, A, B,  8, 15, 11, 14 );
    P2( B, C, D, E, A, 12,  9, 15,  6 );
    P2( A, B, C, D, E,  4,  8,  0, 14 );
    P2( E, A, B, C, D, 13,  9,  5,  6 );
    P2( D, E, A, B, C,  3, 14, 12,  9 );
    P2( C, D, E, A, B,  7,  5,  2, 12 );
    P2( B, C, D, E, A, 15,  6, 13,  9 );
    P2( A, B, C, D, E, 14,  8,  9, 12 );
    P2( E, A, B, C, D,  5,  6,  7,  5 );
    P2( D, E, A, B, C,  6,  5, 10, 15 );
    P2( C, D, E, A, B,  2, 12, 14,  8 );
#undef F
#undef K
#undef Fp
#undef Kp

#define F   F5
#define K   0xA953FD4E
#define Fp  F1
#define Kp  0x00000000
    P2( B, C, D, E, A,  4,  9, 12,  8 );
    P2( A, B, C, D, E,  0, 15, 15,  5 );
    P2( E, A, B, C, D,  5,  5, 10, 12 );
    P2( D, E, A, B, C,  9, 11,  4,  9 );
    P2( C, D, E, A, B,  7,  6,  1, 12 );
    P2( B, C, D, E, A, 12,  8,  5,  5 );
    P2( A, B, C, D, E,  2, 13,  8, 14 );
    P2( E, A, B, C, D, 10, 12,  7,  6 );
    P2( D, E, A, B, C, 14,  5,  6,  8 );
    P2( C, D, E, A, B,  1, 12,  2, 13 );
    P2( B, C, D, E, A,  3, 13, 13,  6 );
    P2( A, B, C, D, E,  8, 14, 14,  5 );
    P2( E, A, B, C, D, 11, 11,  0, 15 );
    P2( D, E, A, B, C,  6,  8,  3, 13 );
    P2( C, D, E, A, B, 15,  5,  9, 11 );
    P2( B, C, D, E, A, 13,  6, 11, 11 );
#undef F
#undef K
#undef Fp
#undef Kp

    C             = ctx->state[1] + C + Dp;
    ctx->state[1] = ctx->state[2] + D + Ep;
    ctx->state[2] = ctx->state[3] + E + Ap;
    ctx->state[3] = ctx->state[4] + A + Bp;
    ctx->state[4] = ctx->state[0] + B + Cp;
    ctx->state[0] = C;
}